

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::doTargetTooHigh(Session *this,Message *msg)

{
  SessionState *this_00;
  IntTConvertor<unsigned_long> *this_01;
  BeginString *beginString;
  UInt64Field *this_02;
  IntTConvertor<unsigned_long> *pIVar1;
  uint64_t msgSeqNum;
  IntTConvertor<unsigned_long> *pIVar2;
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  unsigned_long value_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  beginString = FieldMap::getField<FIX::BeginString>(&(msg->m_header).super_FieldMap);
  this_02 = &FieldMap::getField<FIX::MsgSeqNum>(&(msg->m_header).super_FieldMap)->super_SeqNumField;
  this_00 = &this->m_state;
  pIVar1 = (IntTConvertor<unsigned_long> *)SessionState::getNextTargetMsgSeqNum(this_00);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_70,pIVar1,value);
  std::operator+(&local_f0,"MsgSeqNum too high, expecting ",&local_70);
  std::operator+(&local_d0,&local_f0," but received ");
  pIVar1 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(this_02);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_90,pIVar1,value_00);
  std::operator+(&local_b0,&local_d0,&local_90);
  SessionState::onEvent(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  msgSeqNum = UInt64Field::getValue(this_02);
  SessionState::queue(this_00,msgSeqNum,msg);
  pIVar1 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.first;
  this_01 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.second;
  if (((pIVar1 != (IntTConvertor<unsigned_long> *)0x0 ||
        this_01 != (IntTConvertor<unsigned_long> *)0x0) &&
      (this->m_sendRedundantResendRequests == false)) &&
     (pIVar2 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(this_02), pIVar1 <= pIVar2)) {
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_90,pIVar1,value_01);
    std::operator+(&local_70,"Already sent ResendRequest FROM: ",&local_90);
    std::operator+(&local_f0,&local_70," TO: ");
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_50,this_01,value_02);
    std::operator+(&local_d0,&local_f0,&local_50);
    std::operator+(&local_b0,&local_d0,".  Not sending another.");
    SessionState::onEvent(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  generateResendRequest(this,beginString,(MsgSeqNum *)this_02);
  return;
}

Assistant:

void Session::doTargetTooHigh(const Message &msg) {
  const Header &header = msg.getHeader();
  auto const &beginString = header.getField<BeginString>();
  auto const &msgSeqNum = header.getField<MsgSeqNum>();

  m_state.onEvent(
      "MsgSeqNum too high, expecting " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum()) + " but received "
      + SEQNUM_CONVERTOR::convert(msgSeqNum));

  m_state.queue(msgSeqNum, msg);

  if (m_state.resendRequested()) {
    SessionState::ResendRange range = m_state.resendRange();

    if (!m_sendRedundantResendRequests && msgSeqNum >= range.first) {
      m_state.onEvent(
          "Already sent ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(range.first)
          + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + ".  Not sending another.");
      return;
    }
  }

  generateResendRequest(beginString, msgSeqNum);
}